

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoProvider.cpp
# Opt level: O2

void InfoProvider::initProcessList(void)

{
  int in_ECX;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  QString processListPattern;
  QArrayDataPointer<char16_t> local_20;
  
  QString::QString((QString *)&local_20,"[ \\t]*([0-9]+)");
  initProcessList::anon_class_1_0_00000001::operator()
            ((QString *)&local_80,(anon_class_1_0_00000001 *)&local_20,(QString *)0x2,in_ECX);
  operator+((QString *)&local_68,(QString *)&local_80,"[ \\t]*(C(?:\\+G)?|G)");
  QString::QString((QString *)&local_b0,"[ \\t]*([0-9\\-]+)");
  initProcessList::anon_class_1_0_00000001::operator()
            ((QString *)&local_98,(anon_class_1_0_00000001 *)&local_b0,(QString *)0x8,in_ECX);
  operator+((QString *)&local_50,(QString *)&local_68,(QString *)&local_98);
  operator+(&processListPattern,(QString *)&local_50,"[ \\t]*([^ \\t\\n]+)");
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_20);
  QRegularExpression::setPattern((QString *)&m_processListRegex);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&processListPattern.d);
  return;
}

Assistant:

void InfoProvider::initProcessList() {
    // TODO: maybe to keep compatibility with older (and newer) drivers, firstly find indices,
    //  like in `initGPUInfo`, instead of hard-coded ones?

    /* Process list example:

        # gpu         pid   type     sm    mem    enc    dec    jpg    ofa     fb   ccpm    command
        # Idx           #    C/G      %      %      %      %      %      %     MB     MB    name
            0       2479     G      -      -      -      -      -      -      1      0    kwalletd6
            0       2481     G      -      -      -      -      -      -    624      0    Xorg

      * Parse pattern:
      *     n           n    C/G     n/-    n/-    n/-    n/-    n/-    n/-    n/-    n/-   process name
      */

    auto repeatString = [](const QString &str, int times) {
        QString result;

        for (int i = 0; i < times; i++)
            result += str;

        return result;
    };

#define spacer R"([ \t]*)"

    const QString processListPattern{
        repeatString(spacer "([0-9]+)", 2) + // gpu id, pid
        spacer R"((C(?:\+G)?|G))" + // type
        repeatString(spacer R"(([0-9\-]+))", 8) + // sm, mem, enc, dec, jpg, ofa, fb, ccpm
        spacer R"(([^ \t\n]+))" // process name
    };

    m_processListRegex.setPattern(processListPattern);
}